

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  char *__s_00;
  winsize wVar1;
  in_addr_t iVar2;
  int iVar3;
  int iVar4;
  LIBSSH2_SESSION *session_00;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  void *__buf;
  undefined1 *__ptr;
  ssize_t sVar8;
  ssize_t nread;
  chan_X11_list *next_node;
  fd_set *__arr;
  undefined1 auStack_120 [4];
  uint __i;
  timeval timeval_out;
  fd_set set;
  winsize w_size_bck;
  winsize w_size;
  chan_X11_list *current_node;
  LIBSSH2_POLLFD *fds;
  int nfds;
  int set_debug_on;
  char *buf;
  size_t bufsiz;
  char *password;
  char *username;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  in_addr_t local_30;
  sockaddr_in sin;
  libssh2_socket_t sock;
  int rc;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = 0xff;
  sin.sin_zero[1] = 0xff;
  sin.sin_zero[2] = 0xff;
  sin.sin_zero[3] = 0xff;
  _auStack_120 = 0;
  timeval_out.tv_sec = 10;
  if (argc < 4) {
    fprintf(_stderr,"Usage: %s destination username password",*argv);
    argv_local._4_4_ = -1;
  }
  else {
    iVar2 = inet_addr(argv[1]);
    __s = argv[2];
    __s_00 = argv[3];
    if (4 < argc) {
      fprintf(_stderr,"DEBUG is ON: %d\n",1);
    }
    sin.sin_zero._4_4_ = libssh2_init(0);
    if (sin.sin_zero._4_4_ == 0) {
      sin.sin_zero._0_4_ = socket(2,1,0);
      if (sin.sin_zero._0_4_ == -1) {
        fprintf(_stderr,"failed to open socket!\n");
        argv_local._4_4_ = -1;
      }
      else {
        session._4_2_ = 2;
        session._6_2_ = htons(0x16);
        local_30 = iVar2;
        iVar3 = connect(sin.sin_zero._0_4_,(sockaddr *)((long)&session + 4),0x10);
        if (iVar3 == 0) {
          session_00 = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0);
          sin.sin_zero._4_4_ = libssh2_session_handshake(session_00,sin.sin_zero._0_4_);
          if (sin.sin_zero._4_4_ == 0) {
            if (4 < argc) {
              libssh2_trace(session_00,0x10);
            }
            libssh2_session_callback_set(session_00,4,x11_callback);
            sVar5 = strlen(__s);
            sVar6 = strlen(__s_00);
            sin.sin_zero._4_4_ =
                 libssh2_userauth_password_ex
                           (session_00,__s,sVar5 & 0xffffffff,__s_00,sVar6 & 0xffffffff,0);
            if (sin.sin_zero._4_4_ == 0) {
              lVar7 = libssh2_channel_open_ex(session_00,"session",7,0x200000,0x8000,0,0);
              if (lVar7 == 0) {
                fprintf(_stderr,"Failed to open a new channel\n");
                session_shutdown(session_00);
                shutdown(sin.sin_zero._0_4_,2);
                close(sin.sin_zero._0_4_);
                argv_local._4_4_ = -1;
              }
              else {
                sin.sin_zero._4_4_ =
                     libssh2_channel_request_pty_ex(lVar7,"xterm",5,0,0,0x50,0x18,0,0);
                if (sin.sin_zero._4_4_ == 0) {
                  sin.sin_zero._4_4_ = libssh2_channel_x11_req_ex(lVar7,0,0);
                  if (sin.sin_zero._4_4_ == 0) {
                    sin.sin_zero._4_4_ = libssh2_channel_process_startup(lVar7,"shell",5,0,0);
                    if (sin.sin_zero._4_4_ == 0) {
                      sin.sin_zero._4_4_ = _raw_mode();
                      if (sin.sin_zero._4_4_ == 0) {
                        memset(&w_size_bck,0,8);
                        memset(set.__fds_bits + 0xf,0,8);
                        do {
                          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                            set.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
                          }
                          iVar3 = fileno(_stdin);
                          iVar4 = fileno(_stdin);
                          set.__fds_bits[(long)(iVar4 / 0x40) + -1] =
                               1L << ((byte)((long)iVar3 % 0x40) & 0x3f) |
                               set.__fds_bits[(long)(iVar4 / 0x40) + -1];
                          iVar3 = fileno(_stdin);
                          ioctl(iVar3,0x5413,&w_size_bck);
                          if ((w_size_bck.ws_row != (unsigned_short)set.__fds_bits[0xf]) ||
                             (w_size_bck.ws_col != set.__fds_bits[0xf]._2_2_)) {
                            set.__fds_bits[0xf] =
                                 (__fd_mask)CONCAT22(w_size_bck.ws_col,w_size_bck.ws_row);
                            libssh2_channel_request_pty_size_ex
                                      (lVar7,w_size_bck.ws_col,w_size_bck.ws_row,0);
                          }
                          __buf = calloc(0x2001,1);
                          if (__buf == (void *)0x0) break;
                          __ptr = (undefined1 *)malloc(0x20);
                          if (__ptr == (undefined1 *)0x0) {
                            free(__buf);
                            break;
                          }
                          *__ptr = 2;
                          *(long *)(__ptr + 8) = lVar7;
                          *(undefined8 *)(__ptr + 0x10) = 1;
                          *(undefined8 *)(__ptr + 0x18) = 1;
                          sin.sin_zero._4_4_ = libssh2_poll(__ptr,1,0);
                          if (0 < (int)sin.sin_zero._4_4_) {
                            libssh2_channel_read_ex(lVar7,0,__buf,8);
                            fprintf(_stdout,"%s",__buf);
                            fflush(_stdout);
                          }
                          if (gp_x11_chan == (chan_X11_list *)0x0) {
                            w_size.ws_row = 0;
                            w_size.ws_col = 0;
                            w_size.ws_xpixel = 0;
                            w_size.ws_ypixel = 0;
                            wVar1 = w_size;
                          }
                          else {
                            w_size = (winsize)gp_x11_chan;
                            wVar1 = w_size;
                          }
                          while (w_size = wVar1, w_size != (winsize)0x0) {
                            sin.sin_zero._4_4_ =
                                 x11_send_receive(*(LIBSSH2_CHANNEL **)w_size,
                                                  *(int *)((long)w_size + 8));
                            wVar1 = *(winsize *)((long)w_size + 0x10);
                            if (sin.sin_zero._4_4_ == -1) {
                              shutdown(*(int *)((long)w_size + 8),2);
                              close(*(int *)((long)w_size + 8));
                              remove_node((chan_X11_list *)w_size);
                            }
                          }
                          iVar3 = fileno(_stdin);
                          sin.sin_zero._4_4_ =
                               select(iVar3 + 1,(fd_set *)&timeval_out.tv_usec,(fd_set *)0x0,
                                      (fd_set *)0x0,(timeval *)auStack_120);
                          if (0 < (int)sin.sin_zero._4_4_) {
                            iVar3 = fileno(_stdin);
                            sVar8 = read(iVar3,__buf,1);
                            if (0 < sVar8) {
                              libssh2_channel_write_ex(lVar7,0,__buf,8);
                            }
                          }
                          free(__ptr);
                          free(__buf);
                          iVar3 = libssh2_channel_eof(lVar7);
                        } while (iVar3 != 1);
                        if (lVar7 != 0) {
                          libssh2_channel_free(lVar7);
                        }
                        _normal_mode();
                        libssh2_exit();
                        argv_local._4_4_ = 0;
                      }
                      else {
                        fprintf(_stderr,"Failed to entered in raw mode\n");
                        session_shutdown(session_00);
                        shutdown(sin.sin_zero._0_4_,2);
                        close(sin.sin_zero._0_4_);
                        argv_local._4_4_ = -1;
                      }
                    }
                    else {
                      fprintf(_stderr,"Failed to open a shell\n");
                      session_shutdown(session_00);
                      shutdown(sin.sin_zero._0_4_,2);
                      close(sin.sin_zero._0_4_);
                      argv_local._4_4_ = -1;
                    }
                  }
                  else {
                    fprintf(_stderr,"Failed to request X11 forwarding\n");
                    session_shutdown(session_00);
                    shutdown(sin.sin_zero._0_4_,2);
                    close(sin.sin_zero._0_4_);
                    argv_local._4_4_ = -1;
                  }
                }
                else {
                  fprintf(_stderr,"Failed to request a pty\n");
                  session_shutdown(session_00);
                  shutdown(sin.sin_zero._0_4_,2);
                  close(sin.sin_zero._0_4_);
                  argv_local._4_4_ = -1;
                }
              }
            }
            else {
              fprintf(_stderr,"Failed to authenticate\n");
              session_shutdown(session_00);
              shutdown(sin.sin_zero._0_4_,2);
              close(sin.sin_zero._0_4_);
              argv_local._4_4_ = -1;
            }
          }
          else {
            fprintf(_stderr,"Failed Start the SSH session\n");
            argv_local._4_4_ = -1;
          }
        }
        else {
          fprintf(_stderr,"Failed to established connection!\n");
          argv_local._4_4_ = -1;
        }
      }
    }
    else {
      fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)(uint)sin.sin_zero._4_4_);
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr = 0;
    int rc;
    libssh2_socket_t sock = LIBSSH2_INVALID_SOCKET;
    struct sockaddr_in sin;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    char *username = NULL;
    char *password = NULL;
    size_t bufsiz = 8193;
    char *buf = NULL;
    int set_debug_on = 0;
    int nfds = 1;
    LIBSSH2_POLLFD *fds = NULL;

    /* Chan List struct */
    struct chan_X11_list *current_node = NULL;

    /* Struct winsize for term size */
    struct winsize w_size;
    struct winsize w_size_bck;

    /* For select on stdin */
    fd_set set;
    struct timeval timeval_out;
    timeval_out.tv_sec = 0;
    timeval_out.tv_usec = 10;

    if(argc > 3) {
        hostaddr = inet_addr(argv[1]);
        username = argv[2];
        password = argv[3];
    }
    else {
        fprintf(stderr, "Usage: %s destination username password",
                argv[0]);
        return -1;
    }

    if(argc > 4) {
        set_debug_on = 1;
        fprintf(stderr, "DEBUG is ON: %d\n", set_debug_on);
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket!\n");
        return -1;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;

    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to established connection!\n");
        return -1;
    }
    /* Open a session */
    session = libssh2_session_init();
    rc      = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failed Start the SSH session\n");
        return -1;
    }

    if(set_debug_on == 1)
        libssh2_trace(session, LIBSSH2_TRACE_CONN);

    /* ignore pedantic warnings by gcc on the callback argument */
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wpedantic"
    /* Set X11 Callback */
    libssh2_session_callback_set(session, LIBSSH2_CALLBACK_X11,
                                 (void *)x11_callback);
#pragma GCC diagnostic pop

    /* Authenticate via password */
    rc = libssh2_userauth_password(session, username, password);
    if(rc) {
        fprintf(stderr, "Failed to authenticate\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Open a channel */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Failed to open a new channel\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Request a PTY */
    rc = libssh2_channel_request_pty(channel, "xterm");
    if(rc) {
        fprintf(stderr, "Failed to request a pty\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Request X11 */
    rc = libssh2_channel_x11_req(channel, 0);
    if(rc) {
        fprintf(stderr, "Failed to request X11 forwarding\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Request a shell */
    rc = libssh2_channel_shell(channel);
    if(rc) {
        fprintf(stderr, "Failed to open a shell\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    rc = _raw_mode();
    if(rc) {
        fprintf(stderr, "Failed to entered in raw mode\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    memset(&w_size, 0, sizeof(struct winsize));
    memset(&w_size_bck, 0, sizeof(struct winsize));

    for(;;) {

        FD_ZERO(&set);
        FD_SET(fileno(stdin), &set);

        /* Search if a resize pty has to be send */
        ioctl(fileno(stdin), TIOCGWINSZ, &w_size);
        if((w_size.ws_row != w_size_bck.ws_row) ||
           (w_size.ws_col != w_size_bck.ws_col)) {
            w_size_bck = w_size;

            libssh2_channel_request_pty_size(channel,
                                             w_size.ws_col,
                                             w_size.ws_row);
        }

        buf = calloc(bufsiz, sizeof(char));
        if(!buf)
            break;

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            free(buf);
            break;
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN;
        fds[0].revents = LIBSSH2_POLLFD_POLLIN;

        rc = libssh2_poll(fds, nfds, 0);
        if(rc > 0) {
            libssh2_channel_read(channel, buf, sizeof(buf));
            fprintf(stdout, "%s", buf);
            fflush(stdout);
        }

        /* Looping on X clients */
        if(gp_x11_chan) {
            current_node = gp_x11_chan;
        }
        else
            current_node = NULL;

        while(current_node) {
            struct chan_X11_list *next_node;
            rc = x11_send_receive(current_node->chan, current_node->sock);
            next_node = current_node->next;
            if(rc == -1) {
                shutdown(current_node->sock, SHUT_RDWR);
                close(current_node->sock);
                remove_node(current_node);
            }

            current_node = next_node;
        }

        rc = select((int)(fileno(stdin) + 1), &set, NULL, NULL, &timeval_out);
        if(rc > 0) {
            ssize_t nread;

            /* Data in stdin */
            nread = read(fileno(stdin), buf, 1);
            if(nread > 0)
                libssh2_channel_write(channel, buf, sizeof(buf));
        }

        free(fds);
        free(buf);

        if(libssh2_channel_eof(channel) == 1) {
            break;
        }
    }

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }
    _normal_mode();

    libssh2_exit();

    return 0;
}